

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void VP8LInitBitReader(VP8LBitReader *br,uint8_t *start,size_t length)

{
  size_t sVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  
  br->len = length;
  br->val = 0;
  br->bit_pos = 0;
  br->eos = 0;
  sVar1 = 8;
  if (length < 8) {
    sVar1 = length;
  }
  uVar4 = 0;
  pbVar3 = start;
  for (uVar2 = 0; (uint)((int)sVar1 * 8) != uVar2; uVar2 = uVar2 + 8) {
    uVar4 = uVar4 | (ulong)*pbVar3 << ((byte)uVar2 & 0x3f);
    pbVar3 = pbVar3 + 1;
  }
  br->val = uVar4;
  br->pos = sVar1;
  br->buf = start;
  return;
}

Assistant:

void VP8LInitBitReader(VP8LBitReader* const br, const uint8_t* const start,
                       size_t length) {
  size_t i;
  vp8l_val_t value = 0;
  assert(br != NULL);
  assert(start != NULL);
  assert(length < 0xfffffff8u);   // can't happen with a RIFF chunk.

  br->len = length;
  br->val = 0;
  br->bit_pos = 0;
  br->eos = 0;

  if (length > sizeof(br->val)) {
    length = sizeof(br->val);
  }
  for (i = 0; i < length; ++i) {
    value |= (vp8l_val_t)start[i] << (8 * i);
  }
  br->val = value;
  br->pos = length;
  br->buf = start;
}